

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void array_container_copy(array_container_t *src,array_container_t *dst)

{
  int min;
  
  min = src->cardinality;
  if (dst->capacity < min) {
    array_container_grow(dst,min,false);
  }
  dst->cardinality = min;
  memcpy(dst->array,src->array,(long)min * 2);
  return;
}

Assistant:

void array_container_copy(const array_container_t *src,
                          array_container_t *dst) {
    const int32_t cardinality = src->cardinality;
    if (cardinality > dst->capacity) {
        array_container_grow(dst, cardinality, false);
    }

    dst->cardinality = cardinality;
    memcpy(dst->array, src->array, cardinality * sizeof(uint16_t));
}